

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

bool google::protobuf::io::Tokenizer::ParseInteger(string *text,uint64 max_value,uint64 *output)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  pcVar6 = (text->_M_dataplus)._M_p;
  cVar1 = *pcVar6;
  uVar2 = 10;
  if (cVar1 == '0') {
    if ((byte)(pcVar6[1] | 0x20U) == 0x78) {
      cVar1 = pcVar6[2];
      pcVar6 = pcVar6 + 2;
      uVar2 = 0x10;
      goto LAB_005b525d;
    }
    cVar1 = '0';
    uVar2 = 8;
  }
  else {
LAB_005b525d:
    if (cVar1 == '\0') {
      uVar7 = 0;
      goto LAB_005b52d2;
    }
  }
  uVar7 = 0;
  do {
    pcVar6 = pcVar6 + 1;
    iVar3 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar4 = iVar3 - 0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      uVar4 = iVar3 - 0x57;
    }
    else {
      uVar4 = iVar3 - 0x37;
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        uVar4 = 0xffffffff;
      }
    }
    if (uVar2 <= uVar4) {
      return false;
    }
    uVar5 = (ulong)uVar4;
    if (max_value < uVar5) {
      return false;
    }
    if ((max_value - uVar5) / (ulong)uVar2 < uVar7) {
      return false;
    }
    uVar7 = uVar7 * uVar2 + uVar5;
    cVar1 = *pcVar6;
  } while (cVar1 != '\0');
LAB_005b52d2:
  *output = uVar7;
  return true;
}

Assistant:

bool Tokenizer::ParseInteger(const string& text, uint64 max_value,
                             uint64* output) {
  // Sadly, we can't just use strtoul() since it is only 32-bit and strtoull()
  // is non-standard.  I hate the C standard library.  :(

//  return strtoull(text.c_str(), NULL, 0);

  const char* ptr = text.c_str();
  int base = 10;
  if (ptr[0] == '0') {
    if (ptr[1] == 'x' || ptr[1] == 'X') {
      // This is hex.
      base = 16;
      ptr += 2;
    } else {
      // This is octal.
      base = 8;
    }
  }

  uint64 result = 0;
  for (; *ptr != '\0'; ptr++) {
    int digit = DigitValue(*ptr);
    if (digit < 0 || digit >= base) {
      // The token provided by Tokenizer is invalid. i.e., 099 is an invalid
      // token, but Tokenizer still think it's integer.
      return false;
    }
    if (digit > max_value || result > (max_value - digit) / base) {
      // Overflow.
      return false;
    }
    result = result * base + digit;
  }

  *output = result;
  return true;
}